

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# level_tools.cxx
# Opt level: O1

uint16_t add_unique(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *data,vector<unsigned_short,_std::allocator<unsigned_short>_> *uniq_refs,
                   string *new_data,size_t hint)

{
  pointer pbVar1;
  pointer __s2;
  size_t sVar2;
  size_t sVar3;
  iterator __position;
  vector<unsigned_short,std::allocator<unsigned_short>> *this;
  int iVar4;
  pointer pbVar5;
  long lVar6;
  long lVar7;
  unsigned_short uVar8;
  ulong uVar9;
  unsigned_short uVar10;
  bool bVar11;
  uint16_t idx;
  unsigned_short local_62;
  string *local_60;
  vector<unsigned_short,std::allocator<unsigned_short>> *local_58;
  pointer local_50;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_48;
  long local_40;
  pointer local_38;
  
  pbVar1 = (data->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  local_50 = (data->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
  uVar9 = hint * 0x20;
  bVar11 = pbVar1 + hint == local_50;
  local_60 = new_data;
  local_58 = (vector<unsigned_short,std::allocator<unsigned_short>> *)uniq_refs;
  local_48 = data;
  if (!bVar11) {
    __s2 = (new_data->_M_dataplus)._M_p;
    sVar2 = new_data->_M_string_length;
    do {
      sVar3 = *(size_t *)((long)&pbVar1->_M_string_length + uVar9);
      if ((sVar3 == sVar2) &&
         ((sVar3 == 0 ||
          (iVar4 = bcmp(*(void **)((long)&(pbVar1->_M_dataplus)._M_p + uVar9),__s2,sVar3),
          iVar4 == 0)))) {
        uVar9 = uVar9 >> 5 & 0x7ffffff;
        break;
      }
      pbVar5 = (pointer)((long)&pbVar1[1]._M_dataplus._M_p + uVar9);
      uVar9 = uVar9 + 0x20;
      bVar11 = pbVar5 == local_50;
    } while (!bVar11);
  }
  uVar8 = (unsigned_short)uVar9;
  local_62 = uVar8;
  if (bVar11) {
    bVar11 = hint == 0;
    if (!bVar11) {
      local_38 = (local_60->_M_dataplus)._M_p;
      sVar2 = local_60->_M_string_length;
      lVar6 = hint << 5;
      lVar7 = 0;
      uVar10 = 0;
      local_40 = lVar6;
      do {
        sVar3 = *(size_t *)((long)&pbVar1->_M_string_length + lVar7);
        if ((sVar3 == sVar2) &&
           ((local_62 = uVar10, sVar3 == 0 ||
            (iVar4 = bcmp(*(void **)((long)&(pbVar1->_M_dataplus)._M_p + lVar7),local_38,sVar3),
            lVar6 = local_40, iVar4 == 0)))) break;
        uVar10 = uVar10 + 1;
        lVar7 = lVar7 + 0x20;
        bVar11 = lVar6 == lVar7;
        local_62 = uVar8;
      } while (!bVar11);
    }
    this = local_58;
    if (bVar11) {
      local_62 = (unsigned_short)((uint)((int)local_50 - (int)pbVar1) >> 5);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(local_48,local_60);
      __position._M_current = *(unsigned_short **)(this + 8);
      if (__position._M_current == *(unsigned_short **)(this + 0x10)) {
        std::vector<unsigned_short,std::allocator<unsigned_short>>::
        _M_realloc_insert<unsigned_short_const&>(this,__position,&local_62);
      }
      else {
        *__position._M_current = local_62;
        *(unsigned_short **)(this + 8) = __position._M_current + 1;
      }
    }
  }
  return local_62;
}

Assistant:

static uint16_t add_unique(std::vector<std::string>* data, std::vector<uint16_t>& uniq_refs,
		const std::string& new_data, size_t hint)
{
	std::vector<std::string>::iterator it0 = data->begin();
	for (std::vector<std::string>::iterator it = it0 + hint,
			end = data->end(); it != end; ++it) {
		if (*it == new_data)
			return uint16_t((it - it0) & UINT16_MAX);
	}
	for (std::vector<std::string>::iterator it = it0,
			end = it0 + hint; it != end; ++it) {
		if (*it == new_data)
			return uint16_t((it - it0) & UINT16_MAX);
	}
	uint16_t idx = uint16_t(data->size() & UINT16_MAX);
	data->push_back(new_data);
	uniq_refs.push_back(idx);
	return idx;
}